

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O1

void reader_init(FileReader *reader,char *file_in,MppCodingType type)

{
  FILE *__stream;
  undefined8 *__arg;
  long lVar1;
  char *pcVar2;
  undefined8 uVar3;
  uint uVar4;
  FileReaderImpl *impl;
  uint local_2c;
  
  __stream = fopen(file_in,"rb");
  if (__stream == (FILE *)0x0) {
    __arg = (undefined8 *)0x0;
    _mpp_log_l(2,"mpi_dec_utils","failed to open input file %s\n",0,file_in);
    goto LAB_001065e2;
  }
  __arg = (undefined8 *)mpp_osal_calloc("reader_init");
  if (__arg == (undefined8 *)0x0) {
    _mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"impl","reader_init",0x14a);
    if ((DAT_001102d3 & 0x10) != 0) goto LAB_00106680;
  }
  *__arg = __stream;
  fseek(__stream,0,2);
  lVar1 = ftell(__stream);
  __arg[1] = lVar1;
  fseek(__stream,0,0);
  pcVar2 = strstr(file_in,".ivf");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = strstr(file_in,".jpg");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strstr(file_in,".jpeg");
      if (pcVar2 == (char *)0x0) {
        pcVar2 = strstr(file_in,".mjpeg");
        if ((type != MPP_VIDEO_CodingMJPEG) && (pcVar2 == (char *)0x0)) {
          local_2c = 0;
          mpp_env_get_u32("reader_buf_size",&local_2c,0x1000);
          uVar4 = 0x1000;
          if (0x1000 < local_2c) {
            uVar4 = local_2c;
          }
          local_2c = uVar4 + 0xfff & 0xfffff000;
          *(undefined4 *)((long)__arg + 0x14) = 0;
          __arg[4] = (ulong)local_2c;
          __arg[5] = 0x100;
          *(undefined4 *)(__arg + 6) = 0;
          __arg[7] = read_normal_file;
          *(undefined4 *)((long)__arg + 100) = 0x400;
          goto LAB_001065aa;
        }
      }
    }
    *(undefined4 *)((long)__arg + 0x14) = 1;
    __arg[4] = __arg[1];
    __arg[5] = 0;
    *(undefined4 *)(__arg + 6) = 0;
    __arg[7] = read_jpeg_file;
    *(undefined4 *)((long)__arg + 100) = 1;
    mpp_buffer_group_get(__arg + 10,1,0,"mpi_dec_utils","check_file_type");
    if (__arg[10] == 0) {
      _mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"impl->group",
                 "check_file_type",0xe1);
      if ((DAT_001102d3 & 0x10) != 0) {
LAB_00106680:
        abort();
      }
    }
  }
  else {
    *(undefined4 *)((long)__arg + 0x14) = 2;
    __arg[4] = 0;
    __arg[5] = 0;
    *(undefined4 *)(__arg + 6) = 0x20;
    __arg[7] = read_ivf_file;
    *(undefined4 *)((long)__arg + 100) = 0x400;
    fseek((FILE *)*__arg,0x20,0);
    __arg[8] = (long)*(int *)(__arg + 6);
  }
LAB_001065aa:
  uVar3 = mpp_osal_calloc("reader_init");
  __arg[0xe] = uVar3;
  *(undefined4 *)(__arg + 0xc) = 0;
  pthread_create(__arg + 0xb,(pthread_attr_t *)0x0,reader_worker,__arg);
LAB_001065e2:
  *reader = __arg;
  return;
}

Assistant:

void reader_init(FileReader* reader, char* file_in, MppCodingType type)
{
    FILE *fp_input = fopen(file_in, "rb");
    FileReaderImpl *impl = NULL;

    if (!fp_input) {
        mpp_err("failed to open input file %s\n", file_in);
        *reader = NULL;
        return;
    }

    impl = mpp_calloc(FileReaderImpl, 1);
    mpp_assert(impl);

    impl->fp_input = fp_input;
    fseek(fp_input, 0L, SEEK_END);
    impl->file_size = ftell(fp_input);
    fseek(fp_input, 0L, SEEK_SET);

    check_file_type(impl, file_in, type);

    impl->slots = mpp_calloc(FileBufSlot*, impl->slot_max);

    reader_start(impl);

    *reader = impl;
}